

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

_patch * get_patch_data(unsigned_short patchid)

{
  _patch *p_Var1;
  unsigned_short uVar2;
  
  FCriticalSection::Enter(&patch_lock);
  p_Var1 = patch[patchid & 0x7f];
  if (p_Var1 != (_patch *)0x0) {
    uVar2 = patchid;
    do {
      do {
        if (p_Var1->patchid == uVar2) goto LAB_0036e9bd;
        p_Var1 = p_Var1->next;
      } while (p_Var1 != (_patch *)0x0);
      FCriticalSection::Leave(&patch_lock);
      if (uVar2 < 0x100) {
        return (_patch *)0x0;
      }
      FCriticalSection::Enter(&patch_lock);
      p_Var1 = patch[patchid & 0x7f];
      uVar2 = patchid & 0xff;
    } while (p_Var1 != (_patch *)0x0);
  }
  p_Var1 = (_patch *)0x0;
LAB_0036e9bd:
  FCriticalSection::Leave(&patch_lock);
  return p_Var1;
}

Assistant:

static struct _patch *
get_patch_data(unsigned short patchid) {
	struct _patch *search_patch;

	patch_lock.Enter();

	search_patch = patch[patchid & 0x007F];

	if (search_patch == NULL) {
		patch_lock.Leave();
		return NULL;
	}

	while (search_patch) {
		if (search_patch->patchid == patchid) {
			patch_lock.Leave();
			return search_patch;
		}
		search_patch = search_patch->next;
	}
	if ((patchid >> 8) != 0) {
		patch_lock.Leave();
		return (get_patch_data(patchid & 0x00FF));
	}
	patch_lock.Leave();
	return NULL;
}